

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O0

uint sad64x32(uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride)

{
  uint uVar1;
  uint uVar2;
  uint32_t sum;
  uint half_width;
  int in_stack_00000094;
  uint8_t *in_stack_00000098;
  int in_stack_000000a4;
  uint8_t *in_stack_000000a8;
  
  uVar1 = sad32x32(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  uVar2 = sad32x32(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,in_stack_00000094);
  return uVar2 + uVar1;
}

Assistant:

static unsigned int sad64x32(const uint8_t *src_ptr, int src_stride,
                             const uint8_t *ref_ptr, int ref_stride) {
  unsigned int half_width = 32;
  uint32_t sum = sad32x32(src_ptr, src_stride, ref_ptr, ref_stride);
  src_ptr += half_width;
  ref_ptr += half_width;
  sum += sad32x32(src_ptr, src_stride, ref_ptr, ref_stride);
  return sum;
}